

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O1

DdNode * Kit_GraphToBdd(DdManager *dd,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  int iVar3;
  DdNode *pDVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  
  uVar1 = pGraph->nLeaves;
  if ((int)uVar1 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x67,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
  }
  if ((int)uVar1 <= pGraph->nSize) {
    if (pGraph->fConst == 0) {
      uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if (uVar5 < uVar1) {
        pDVar4 = Cudd_bddIthVar(dd,uVar5);
      }
      else {
        iVar3 = pGraph->nLeaves;
        if (iVar3 < 1) {
          puVar8 = (undefined1 *)0x0;
        }
        else {
          lVar9 = 0;
          lVar7 = -0x18;
          do {
            lVar6 = lVar7;
            pKVar2 = pGraph->pNodes;
            pDVar4 = Cudd_bddIthVar(dd,(int)lVar9);
            *(DdNode **)((long)&pKVar2[1].field_2 + lVar6) = pDVar4;
            lVar9 = lVar9 + 1;
            iVar3 = pGraph->nLeaves;
            lVar7 = lVar6 + 0x18;
          } while (lVar9 < iVar3);
          puVar8 = &pKVar2[1].eEdge0.field_0x0 + lVar6;
        }
        if (iVar3 < pGraph->nSize) {
          lVar9 = (long)iVar3;
          lVar7 = lVar9 * 0x18 + -0x18;
          do {
            lVar6 = lVar7;
            pKVar2 = pGraph->pNodes;
            uVar1 = *(uint *)(&pKVar2[1].eEdge0.field_0x0 + lVar6);
            uVar5 = *(uint *)(&pKVar2[1].eEdge1.field_0x0 + lVar6);
            pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar1 & 1) ^
                                    (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar5 & 1) ^
                                 (ulong)pKVar2[uVar5 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pKVar2[1].field_2 + lVar6) = pDVar4;
            Cudd_Ref(pDVar4);
            lVar9 = lVar9 + 1;
            lVar7 = lVar6 + 0x18;
          } while (lVar9 < pGraph->nSize);
          puVar8 = &pKVar2[1].eEdge0.field_0x0 + lVar6;
        }
        pDVar4 = *(DdNode **)(puVar8 + 8);
        Cudd_Ref(pDVar4);
        lVar7 = (long)pGraph->nLeaves;
        if (pGraph->nLeaves < pGraph->nSize) {
          lVar9 = lVar7 * 0x18 + 8;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar9));
            lVar7 = lVar7 + 1;
            lVar9 = lVar9 + 0x18;
          } while (lVar7 < pGraph->nSize);
        }
        Cudd_Deref(pDVar4);
      }
    }
    else {
      pDVar4 = dd->one;
    }
    return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar4);
  }
  __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                ,0x68,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
}

Assistant:

DdNode * Kit_GraphToBdd( DdManager * dd, Kit_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Kit_GraphVarInt(pGraph)), Kit_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Kit_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Kit_GraphIsComplement(pGraph) );
}